

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  pointer *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data_01;
  RefData<vk::Handle<(vk::HandleType)16>_> data_02;
  allocator<char> local_239;
  string local_238;
  Move<vk::Handle<(vk::HandleType)16>_> local_218;
  RefData<vk::Handle<(vk::HandleType)16>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> obj3;
  RefData<vk::Handle<(vk::HandleType)16>_> local_198;
  undefined1 local_178 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> obj2;
  RefData<vk::Handle<(vk::HandleType)16>_> local_138;
  undefined1 local_118 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> obj1;
  Move<vk::Handle<(vk::HandleType)16>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> obj0;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = &res.pSetLayouts.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Environment::Environment((Environment *)this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  PipelineLayout::Resources::Resources((Resources *)this_00,(Environment *)this,params);
  PipelineLayout::create(&local_e8,(Environment *)this,(Resources *)this_00,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  data.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data.object.m_internal = local_c8.object.m_internal;
  data.deleter.m_device = local_c8.deleter.m_device;
  data.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_e8);
  PipelineLayout::create
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.pSetLayouts.
              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_138,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_00.object.m_internal = local_138.object.m_internal;
  data_00.deleter.m_device = local_138.deleter.m_device;
  data_00.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_118,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator);
  PipelineLayout::create
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.pSetLayouts.
              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_198,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_198.deleter.m_deviceIface;
  data_01.object.m_internal = local_198.object.m_internal;
  data_01.deleter.m_device = local_198.deleter.m_device;
  data_01.deleter.m_allocator = local_198.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_178,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator);
  PipelineLayout::create
            (&local_218,
             (Environment *)
             &res.pSetLayouts.
              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator,params)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
  data_02.deleter.m_deviceIface = local_1f8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1f8.object.m_internal;
  data_02.deleter.m_device = local_1f8.deleter.m_device;
  data_02.deleter.m_allocator = local_1f8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_1d8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_218);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_1d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_178);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_118);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Ok",&local_239);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  PipelineLayout::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}